

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O2

void pzshape::TPZShapeCube::Shape3dCubeInternal
               (TPZVec<Fad<double>_> *x,int order,TPZVec<Fad<double>_> *phi)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  TPZVec<Fad<double>_> phi2;
  TPZVec<Fad<double>_> phi1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_80;
  undefined1 local_70 [32];
  TPZVec<Fad<double>_> phi0;
  
  if (0 < order) {
    phi1._vptr_TPZVec = (_func_int **)0x0;
    Fad<double>::Fad((Fad<double> *)&phi0,3,(double *)&phi1);
    (*phi->_vptr_TPZVec[2])(phi,(ulong)(uint)(order * order * order),&phi0);
    Fad<double>::~Fad((Fad<double> *)&phi0);
    phi2._vptr_TPZVec = (_func_int **)0x0;
    Fad<double>::Fad((Fad<double> *)&phi1,3,(double *)&phi2);
    TPZVec<Fad<double>_>::TPZVec(&phi0,0x14,(Fad<double> *)&phi1);
    Fad<double>::~Fad((Fad<double> *)&phi1);
    local_70._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)0x0;
    Fad<double>::Fad((Fad<double> *)&phi2,3,(double *)local_70);
    TPZVec<Fad<double>_>::TPZVec(&phi1,0x14,(Fad<double> *)&phi2);
    Fad<double>::~Fad((Fad<double> *)&phi2);
    local_80.fadexpr_.left_ = (Fad<double> *)0x0;
    Fad<double>::Fad((Fad<double> *)local_70,3,(double *)&local_80);
    TPZVec<Fad<double>_>::TPZVec(&phi2,0x14,(Fad<double> *)local_70);
    Fad<double>::~Fad((Fad<double> *)local_70);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(x->fStore,order,&phi0);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(x->fStore + 1,order,&phi1);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(x->fStore + 2,order,&phi2);
    uVar2 = (ulong)(uint)order;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      lVar3 = lVar4;
      for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
        for (lVar1 = 0; uVar2 * 0x20 != lVar1; lVar1 = lVar1 + 0x20) {
          local_80.fadexpr_.left_ = phi0.fStore + uVar5;
          local_80.fadexpr_.right_ = phi1.fStore + uVar6;
          local_70._8_8_ = (long)&(phi2.fStore)->val_ + lVar1;
          local_70._0_8_ = &local_80;
          Fad<double>::operator=
                    ((Fad<double> *)((long)&phi->fStore->val_ + lVar1 + lVar3),
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                      *)local_70);
        }
        lVar3 = lVar3 + uVar2 * 0x20;
      }
      lVar4 = lVar4 + uVar2 * uVar2 * 0x20;
    }
    TPZVec<Fad<double>_>::~TPZVec(&phi2);
    TPZVec<Fad<double>_>::~TPZVec(&phi1);
    TPZVec<Fad<double>_>::~TPZVec(&phi0);
  }
  return;
}

Assistant:

void TPZShapeCube::Shape3dCubeInternal(TPZVec<FADREAL> &x, int order,TPZVec<FADREAL> &phi)
	{
		const int ndim = 3;
		
		if(order < 1) return;
		int ord = order;//fSideOrder[18]-1;
		order = order*order*order;
		phi.Resize(order, FADREAL(ndim, 0.0));
		TPZVec<FADREAL> phi0(20, FADREAL(ndim, 0.0)),
		phi1(20, FADREAL(ndim, 0.0)),
		phi2(20, FADREAL(ndim, 0.0));
		TPZShapeLinear::FADfOrthogonal(x[0],ord,phi0);
		TPZShapeLinear::FADfOrthogonal(x[1],ord,phi1);
		TPZShapeLinear::FADfOrthogonal(x[2],ord,phi2);
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					int index = ord*(ord*i+j)+k;
					//phi(index,0) =  phi0(i,0)* phi1(j,0)* phi2(k,0);
					phi[index] =  phi0[i] * phi1[j] * phi2[k];
					/*dphi(0,index) = dphi0(0,i)* phi1(j,0)* phi2(k,0);
					 dphi(1,index) =  phi0(i,0)*dphi1(0,j)* phi2(k,0);
					 dphi(2,index) =  phi0(i,0)* phi1(j,0)*dphi2(0,k);
					 */
				}
			}
		}
	}